

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.h
# Opt level: O2

void __thiscall
state_machine::variant::
Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C>::Variant
          (Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *this,
          Variant<(anonymous_namespace)::A,_(anonymous_namespace)::B,_VariantMoveTest::C> *rhs)

{
  index_type iVar1;
  
  this->storage_ = (storage_type)0x0;
  this->index_ = '\0';
  iVar1 = rhs->index_;
  if (iVar1 == '\0') {
    return;
  }
  if (iVar1 != '\x02') {
    if (iVar1 == '\x01') {
      get<(anonymous_namespace)::A,_0>(rhs);
      set<(anonymous_namespace)::A,_(anonymous_namespace)::A,_0>(this,(A *)rhs);
      return;
    }
    get<VariantMoveTest::C,_0>(rhs);
    set<VariantMoveTest::C,_VariantMoveTest::C,_0>(this,(C *)rhs);
    return;
  }
  get<(anonymous_namespace)::B,_0>(rhs);
  return;
}

Assistant:

Variant(Variant&& rhs) noexcept(
        // NOLINTNEXTLINE(performance-noexcept-move-constructor)
        stdx::conjunction<std::is_nothrow_move_constructible<Ts>...>::value) {
        if (!rhs.holds<empty>()) {
            on_alternate<op::pop_front<op::repack<alternative_index_map, bijection>>>::invoke(
                rhs, [this](auto& s) {
                    using state_type = std::remove_reference_t<decltype(s)>;
                    if (std::is_nothrow_move_constructible<state_type>::value) {
                        this->set<state_type>(std::move(s));
                    }
                });
        }
    }